

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O1

void Abc_NtkReassignIds(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  long *plVar4;
  Abc_Obj_t *pAVar5;
  long lVar6;
  Vec_Ptr_t *pVVar7;
  void **ppvVar8;
  Abc_Obj_t *pAVar9;
  Vec_Ptr_t *pVVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                  ,0x716,"void Abc_NtkReassignIds(Abc_Ntk_t *)");
  }
  iVar15 = pNtk->nObjs;
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  iVar11 = 8;
  if (6 < iVar15 - 1U) {
    iVar11 = iVar15;
  }
  pVVar7->nSize = 0;
  pVVar7->nCap = iVar11;
  if (iVar11 == 0) {
    ppvVar8 = (void **)0x0;
  }
  else {
    ppvVar8 = (void **)malloc((long)iVar11 << 3);
  }
  pVVar7->pArray = ppvVar8;
  pAVar9 = Abc_AigConst1(pNtk);
  if (pAVar9->Id != 0) {
    __assert_fail("pConst1->Id == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                  ,0x71c,"void Abc_NtkReassignIds(Abc_Ntk_t *)");
  }
  uVar1 = pVVar7->nCap;
  if (pVVar7->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (pVVar7->pArray == (void **)0x0) {
        ppvVar8 = (void **)malloc(0x80);
      }
      else {
        ppvVar8 = (void **)realloc(pVVar7->pArray,0x80);
      }
      iVar15 = 0x10;
    }
    else {
      iVar15 = uVar1 * 2;
      if (iVar15 <= (int)uVar1) goto LAB_0086df15;
      if (pVVar7->pArray == (void **)0x0) {
        ppvVar8 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar8 = (void **)realloc(pVVar7->pArray,(ulong)uVar1 << 4);
      }
    }
    pVVar7->pArray = ppvVar8;
    pVVar7->nCap = iVar15;
  }
LAB_0086df15:
  iVar15 = pVVar7->nSize;
  pVVar7->nSize = iVar15 + 1;
  pVVar7->pArray[iVar15] = pAVar9;
  pVVar10 = pNtk->vPis;
  if (0 < pVVar10->nSize) {
    lVar14 = 0;
    do {
      pvVar3 = pVVar10->pArray[lVar14];
      uVar1 = pVVar7->nSize;
      *(uint *)((long)pvVar3 + 0x10) = uVar1;
      uVar2 = pVVar7->nCap;
      if (uVar1 == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (pVVar7->pArray == (void **)0x0) {
            ppvVar8 = (void **)malloc(0x80);
          }
          else {
            ppvVar8 = (void **)realloc(pVVar7->pArray,0x80);
          }
          iVar15 = 0x10;
        }
        else {
          iVar15 = uVar2 * 2;
          if (iVar15 <= (int)uVar2) goto LAB_0086dfaa;
          if (pVVar7->pArray == (void **)0x0) {
            ppvVar8 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar8 = (void **)realloc(pVVar7->pArray,(ulong)uVar2 << 4);
          }
        }
        pVVar7->pArray = ppvVar8;
        pVVar7->nCap = iVar15;
      }
LAB_0086dfaa:
      iVar15 = pVVar7->nSize;
      pVVar7->nSize = iVar15 + 1;
      pVVar7->pArray[iVar15] = pvVar3;
      lVar14 = lVar14 + 1;
      pVVar10 = pNtk->vPis;
    } while (lVar14 < pVVar10->nSize);
  }
  pVVar10 = pNtk->vPos;
  if (0 < pVVar10->nSize) {
    lVar14 = 0;
    do {
      pvVar3 = pVVar10->pArray[lVar14];
      uVar1 = pVVar7->nSize;
      *(uint *)((long)pvVar3 + 0x10) = uVar1;
      uVar2 = pVVar7->nCap;
      if (uVar1 == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (pVVar7->pArray == (void **)0x0) {
            ppvVar8 = (void **)malloc(0x80);
          }
          else {
            ppvVar8 = (void **)realloc(pVVar7->pArray,0x80);
          }
          iVar15 = 0x10;
        }
        else {
          iVar15 = uVar2 * 2;
          if (iVar15 <= (int)uVar2) goto LAB_0086e05a;
          if (pVVar7->pArray == (void **)0x0) {
            ppvVar8 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar8 = (void **)realloc(pVVar7->pArray,(ulong)uVar2 << 4);
          }
        }
        pVVar7->pArray = ppvVar8;
        pVVar7->nCap = iVar15;
      }
LAB_0086e05a:
      iVar15 = pVVar7->nSize;
      pVVar7->nSize = iVar15 + 1;
      pVVar7->pArray[iVar15] = pvVar3;
      lVar14 = lVar14 + 1;
      pVVar10 = pNtk->vPos;
    } while (lVar14 < pVVar10->nSize);
  }
  pVVar10 = pNtk->vBoxes;
  if (0 < pVVar10->nSize) {
    lVar14 = 0;
    do {
      plVar4 = (long *)pVVar10->pArray[lVar14];
      uVar1 = pVVar7->nSize;
      *(uint *)(plVar4 + 2) = uVar1;
      uVar2 = pVVar7->nCap;
      if (uVar1 == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (pVVar7->pArray == (void **)0x0) {
            ppvVar8 = (void **)malloc(0x80);
          }
          else {
            ppvVar8 = (void **)realloc(pVVar7->pArray,0x80);
          }
          iVar15 = 0x10;
        }
        else {
          iVar15 = uVar2 * 2;
          if (iVar15 <= (int)uVar2) goto LAB_0086e113;
          if (pVVar7->pArray == (void **)0x0) {
            ppvVar8 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar8 = (void **)realloc(pVVar7->pArray,(ulong)uVar2 << 4);
          }
        }
        pVVar7->pArray = ppvVar8;
        pVVar7->nCap = iVar15;
      }
LAB_0086e113:
      iVar15 = pVVar7->nSize;
      pVVar7->nSize = iVar15 + 1;
      pVVar7->pArray[iVar15] = plVar4;
      if (0 < *(int *)((long)plVar4 + 0x1c)) {
        lVar12 = 0;
        do {
          pvVar3 = *(void **)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                             (long)*(int *)(plVar4[4] + lVar12 * 4) * 8);
          uVar1 = pVVar7->nSize;
          *(uint *)((long)pvVar3 + 0x10) = uVar1;
          uVar2 = pVVar7->nCap;
          if (uVar1 == uVar2) {
            if ((int)uVar2 < 0x10) {
              if (pVVar7->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc(0x80);
              }
              else {
                ppvVar8 = (void **)realloc(pVVar7->pArray,0x80);
              }
              iVar15 = 0x10;
            }
            else {
              iVar15 = uVar2 * 2;
              if (iVar15 <= (int)uVar2) goto LAB_0086e1aa;
              if (pVVar7->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc((ulong)uVar2 << 4);
              }
              else {
                ppvVar8 = (void **)realloc(pVVar7->pArray,(ulong)uVar2 << 4);
              }
            }
            pVVar7->pArray = ppvVar8;
            pVVar7->nCap = iVar15;
          }
LAB_0086e1aa:
          iVar15 = pVVar7->nSize;
          pVVar7->nSize = iVar15 + 1;
          pVVar7->pArray[iVar15] = pvVar3;
          lVar12 = lVar12 + 1;
        } while (lVar12 < *(int *)((long)plVar4 + 0x1c));
      }
      if (0 < *(int *)((long)plVar4 + 0x2c)) {
        lVar12 = 0;
        do {
          pvVar3 = *(void **)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                             (long)*(int *)(plVar4[6] + lVar12 * 4) * 8);
          uVar1 = pVVar7->nSize;
          *(uint *)((long)pvVar3 + 0x10) = uVar1;
          uVar2 = pVVar7->nCap;
          if (uVar1 == uVar2) {
            if ((int)uVar2 < 0x10) {
              if (pVVar7->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc(0x80);
              }
              else {
                ppvVar8 = (void **)realloc(pVVar7->pArray,0x80);
              }
              iVar15 = 0x10;
            }
            else {
              iVar15 = uVar2 * 2;
              if (iVar15 <= (int)uVar2) goto LAB_0086e25d;
              if (pVVar7->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc((ulong)uVar2 << 4);
              }
              else {
                ppvVar8 = (void **)realloc(pVVar7->pArray,(ulong)uVar2 << 4);
              }
            }
            pVVar7->pArray = ppvVar8;
            pVVar7->nCap = iVar15;
          }
LAB_0086e25d:
          iVar15 = pVVar7->nSize;
          pVVar7->nSize = iVar15 + 1;
          pVVar7->pArray[iVar15] = pvVar3;
          lVar12 = lVar12 + 1;
        } while (lVar12 < *(int *)((long)plVar4 + 0x2c));
      }
      lVar14 = lVar14 + 1;
      pVVar10 = pNtk->vBoxes;
    } while (lVar14 < pVVar10->nSize);
  }
  pVVar10 = Abc_AigDfs(pNtk,1,0);
  if (0 < pVVar10->nSize) {
    lVar14 = 0;
    do {
      pAVar5 = (Abc_Obj_t *)pVVar10->pArray[lVar14];
      if (pAVar5 != pAVar9) {
        uVar1 = pVVar7->nSize;
        pAVar5->Id = uVar1;
        uVar2 = pVVar7->nCap;
        if (uVar1 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (pVVar7->pArray == (void **)0x0) {
              ppvVar8 = (void **)malloc(0x80);
            }
            else {
              ppvVar8 = (void **)realloc(pVVar7->pArray,0x80);
            }
            iVar15 = 0x10;
          }
          else {
            iVar15 = uVar2 * 2;
            if (iVar15 <= (int)uVar2) goto LAB_0086e344;
            if (pVVar7->pArray == (void **)0x0) {
              ppvVar8 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar8 = (void **)realloc(pVVar7->pArray,(ulong)uVar2 << 4);
            }
          }
          pVVar7->pArray = ppvVar8;
          pVVar7->nCap = iVar15;
        }
LAB_0086e344:
        iVar15 = pVVar7->nSize;
        pVVar7->nSize = iVar15 + 1;
        pVVar7->pArray[iVar15] = pAVar5;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < pVVar10->nSize);
  }
  if (pVVar10->pArray != (void **)0x0) {
    free(pVVar10->pArray);
    pVVar10->pArray = (void **)0x0;
  }
  if (pVVar10 != (Vec_Ptr_t *)0x0) {
    free(pVVar10);
  }
  if (pVVar7->nSize != pNtk->nObjs) {
    __assert_fail("Vec_PtrSize(vObjsNew) == pNtk->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                  ,0x744,"void Abc_NtkReassignIds(Abc_Ntk_t *)");
  }
  pVVar10 = pNtk->vObjs;
  if (0 < pVVar10->nSize) {
    ppvVar8 = pVVar10->pArray;
    lVar14 = 0;
    do {
      plVar4 = (long *)ppvVar8[lVar14];
      if (plVar4 != (long *)0x0) {
        if (0 < *(int *)((long)plVar4 + 0x1c)) {
          lVar12 = plVar4[4];
          lVar6 = *(long *)(*(long *)(*plVar4 + 0x20) + 8);
          lVar13 = 0;
          do {
            *(undefined4 *)(lVar12 + lVar13 * 4) =
                 *(undefined4 *)(*(long *)(lVar6 + (long)*(int *)(lVar12 + lVar13 * 4) * 8) + 0x10);
            lVar13 = lVar13 + 1;
          } while (lVar13 < *(int *)((long)plVar4 + 0x1c));
        }
        if (0 < *(int *)((long)plVar4 + 0x2c)) {
          lVar12 = plVar4[6];
          lVar6 = *(long *)(*(long *)(*plVar4 + 0x20) + 8);
          lVar13 = 0;
          do {
            *(undefined4 *)(lVar12 + lVar13 * 4) =
                 *(undefined4 *)(*(long *)(lVar6 + (long)*(int *)(lVar12 + lVar13 * 4) * 8) + 0x10);
            lVar13 = lVar13 + 1;
          } while (lVar13 < *(int *)((long)plVar4 + 0x2c));
        }
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < pVVar10->nSize);
  }
  if (pVVar10->pArray != (void **)0x0) {
    free(pVVar10->pArray);
    pVVar10->pArray = (void **)0x0;
  }
  if (pVVar10 != (Vec_Ptr_t *)0x0) {
    free(pVVar10);
  }
  pNtk->vObjs = pVVar7;
  Abc_AigRehash((Abc_Aig_t *)pNtk->pManFunc);
  return;
}

Assistant:

void Abc_NtkReassignIds( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Vec_Ptr_t * vObjsNew;
    Abc_Obj_t * pNode, * pTemp, * pConst1;
    int i, k;
    assert( Abc_NtkIsStrash(pNtk) );
//printf( "Total = %d. Current = %d.\n", Abc_NtkObjNumMax(pNtk), Abc_NtkObjNum(pNtk) );
    // start the array of objects with new IDs
    vObjsNew = Vec_PtrAlloc( pNtk->nObjs );
    // put constant node first
    pConst1 = Abc_AigConst1(pNtk);
    assert( pConst1->Id == 0 );
    Vec_PtrPush( vObjsNew, pConst1 );
    // put PI nodes next
    Abc_NtkForEachPi( pNtk, pNode, i )
    {
        pNode->Id = Vec_PtrSize( vObjsNew );
        Vec_PtrPush( vObjsNew, pNode );
    }
    // put PO nodes next
    Abc_NtkForEachPo( pNtk, pNode, i )
    {
        pNode->Id = Vec_PtrSize( vObjsNew );
        Vec_PtrPush( vObjsNew, pNode );
    }
    // put latches and their inputs/outputs next
    Abc_NtkForEachBox( pNtk, pNode, i )
    {
        pNode->Id = Vec_PtrSize( vObjsNew );
        Vec_PtrPush( vObjsNew, pNode );
        Abc_ObjForEachFanin( pNode, pTemp, k )
        {
            pTemp->Id = Vec_PtrSize( vObjsNew );
            Vec_PtrPush( vObjsNew, pTemp );
        }
        Abc_ObjForEachFanout( pNode, pTemp, k )
        {
            pTemp->Id = Vec_PtrSize( vObjsNew );
            Vec_PtrPush( vObjsNew, pTemp );
        }
    }
    // finally, internal nodes in the DFS order
    vNodes = Abc_AigDfs( pNtk, 1, 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        if ( pNode == pConst1 )
            continue;
        pNode->Id = Vec_PtrSize( vObjsNew );
        Vec_PtrPush( vObjsNew, pNode );
    }
    Vec_PtrFree( vNodes );
    assert( Vec_PtrSize(vObjsNew) == pNtk->nObjs );

    // update the fanin/fanout arrays
    Abc_NtkForEachObj( pNtk, pNode, i )
    {
        Abc_ObjForEachFanin( pNode, pTemp, k )
            pNode->vFanins.pArray[k] = pTemp->Id;
        Abc_ObjForEachFanout( pNode, pTemp, k )
            pNode->vFanouts.pArray[k] = pTemp->Id;
    }

    // replace the array of objs
    Vec_PtrFree( pNtk->vObjs );
    pNtk->vObjs = vObjsNew;

    // rehash the AIG
    Abc_AigRehash( (Abc_Aig_t *)pNtk->pManFunc );

    // update the name manager!!!
}